

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::addError(Reader *this,String *message,Token *token,Location extra)

{
  ErrorInfo info;
  undefined1 local_58 [24];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  Location local_20;
  
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_58._0_4_ = token->type_;
  local_58._4_4_ = *(undefined4 *)&token->field_0x4;
  local_58._8_8_ = token->start_;
  local_58._16_8_ = token->end_;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_assign((string *)&local_40);
  local_20 = extra;
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
            (&this->errors_,(value_type *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p);
  }
  return false;
}

Assistant:

bool Reader::addError(const String& message, Token& token, Location extra) {
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = extra;
  errors_.push_back(info);
  return false;
}